

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-player.c
# Opt level: O1

void display_panel(panel *p,_Bool left_adj,region *bounds)

{
  wchar_t x;
  int iVar1;
  int iVar2;
  panel_line *ppVar3;
  char *__s;
  wchar_t x_00;
  int iVar4;
  wchar_t wVar5;
  wchar_t n;
  size_t sVar6;
  int iVar7;
  ulong uVar8;
  undefined7 in_register_00000031;
  long lVar9;
  char **ppcVar10;
  wchar_t y;
  size_t sVar11;
  
  x = bounds->col;
  iVar1 = bounds->row;
  iVar2 = bounds->width;
  region_erase((region_conflict *)bounds);
  iVar7 = 0;
  if ((int)CONCAT71(in_register_00000031,left_adj) != 0) {
    sVar11 = p->len;
    if (sVar11 == 0) {
      iVar7 = 2;
    }
    else {
      ppcVar10 = &p->lines->label;
      iVar7 = 0;
      do {
        iVar4 = 0;
        if (*ppcVar10 != (char *)0x0) {
          sVar6 = strlen(*ppcVar10);
          iVar4 = (int)sVar6;
        }
        if (iVar7 <= iVar4) {
          iVar7 = iVar4;
        }
        ppcVar10 = ppcVar10 + 5;
        sVar11 = sVar11 - 1;
      } while (sVar11 != 0);
      iVar7 = iVar7 + 2;
    }
  }
  if (p->len != 0) {
    wVar5 = iVar2 - iVar7;
    lVar9 = 0x10;
    uVar8 = 0;
    do {
      ppVar3 = p->lines;
      __s = *(char **)(ppVar3->value + lVar9 + -0x18);
      if (__s != (char *)0x0) {
        y = iVar1 + (int)uVar8;
        sVar6 = strlen(__s);
        Term_putstr(x,y,(wchar_t)sVar6,L'\x01',__s);
        sVar6 = strlen(ppVar3->value + lVar9 + -0x10);
        n = (wchar_t)sVar6;
        if (wVar5 <= (wchar_t)sVar6) {
          n = wVar5 + L'\xffffffff';
        }
        x_00 = (iVar2 + x) - n;
        if (left_adj) {
          x_00 = iVar7 + x;
        }
        Term_putstr(x_00,y,n,(uint)(byte)ppVar3->value[lVar9 + -0x20],ppVar3->value + lVar9 + -0x10)
        ;
      }
      uVar8 = uVar8 + 1;
      lVar9 = lVar9 + 0x28;
    } while (uVar8 < p->len);
  }
  return;
}

Assistant:

static void display_panel(const struct panel *p, bool left_adj,
		const region *bounds)
{
	size_t i;
	int col = bounds->col;
	int row = bounds->row;
	int w = bounds->width;
	int offset = 0;

	region_erase(bounds);

	if (left_adj) {
		for (i = 0; i < p->len; i++) {
			struct panel_line *pl = &p->lines[i];

			int len = pl->label ? strlen(pl->label) : 0;
			if (offset < len) offset = len;
		}
		offset += 2;
	}

	for (i = 0; i < p->len; i++, row++) {
		int len;
		struct panel_line *pl = &p->lines[i];

		if (!pl->label)
			continue;

		Term_putstr(col, row, strlen(pl->label), COLOUR_WHITE, pl->label);

		len = strlen(pl->value);
		len = len < w - offset ? len : w - offset - 1;

		if (left_adj)
			Term_putstr(col+offset, row, len, pl->attr, pl->value);
		else
			Term_putstr(col+w-len, row, len, pl->attr, pl->value);
	}
}